

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O2

void createVars(vec<vec<IntVar_*>_> *x,int n,int m,int min,int max,bool el)

{
  IntVar *pIVar1;
  ulong uVar2;
  int j;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  vec<vec<IntVar_*>_>::growTo(x,n);
  uVar2 = 0;
  uVar4 = 0;
  if (0 < m) {
    uVar4 = (ulong)(uint)m;
  }
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar2;
  }
  for (; uVar2 != uVar5; uVar2 = uVar2 + 1) {
    lVar6 = uVar2 * 0x10;
    vec<IntVar_*>::growTo((vec<IntVar_*> *)(*(long *)(x + 8) + lVar6),m);
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      pIVar1 = newIntVar(min,max);
      *(IntVar **)(*(long *)(*(long *)(x + 8) + 8 + lVar6) + uVar3 * 8) = pIVar1;
      if (el) {
        IntVar::specialiseToEL(*(IntVar **)(*(long *)(*(long *)(x + 8) + 8 + lVar6) + uVar3 * 8));
      }
    }
  }
  return;
}

Assistant:

void createVars(vec<vec<IntVar*> >& x, int n, int m, int min, int max, bool el) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i].growTo(m);
		for (int j = 0; j < m; j++) {
			x[i][j] = newIntVar(min, max);
			if (el) {
				x[i][j]->specialiseToEL();
			}
		}
	}
}